

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O3

void __thiscall
Pl_Function::Pl_Function
          (Pl_Function *this,char *identifier,Pipeline *next,writer_c_t fn,void *udata)

{
  void *pvVar1;
  undefined8 uVar2;
  function<void_(const_unsigned_char_*,_unsigned_long)> *this_00;
  undefined8 *puVar3;
  pointer *__ptr;
  _Any_data __tmp;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_002ea558;
  this_00 = (function<void_(const_unsigned_char_*,_unsigned_long)> *)operator_new(0x20);
  local_58 = (code *)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::function
            (this_00,(function<void_(const_unsigned_char_*,_unsigned_long)> *)&local_68);
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>.
  super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl = (Members *)this_00;
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
    this_00 = &((this->m)._M_t.
                super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>
                ._M_t.
                super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>
                .super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl)->fn;
  }
  local_68._8_8_ = 0;
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = identifier;
  puVar3[1] = fn;
  puVar3[2] = udata;
  local_68._0_4_ = SUB84(puVar3,0);
  local_68._4_4_ = (undefined4)((ulong)puVar3 >> 0x20);
  local_48 = local_68._0_4_;
  uStack_44 = local_68._4_4_;
  uStack_40 = local_68._8_4_;
  uStack_3c = local_68._12_4_;
  pvVar1 = *(void **)&(this_00->super__Function_base)._M_functor;
  uVar2 = *(undefined8 *)((long)&(this_00->super__Function_base)._M_functor + 8);
  *(undefined4 *)&(this_00->super__Function_base)._M_functor = local_68._0_4_;
  *(undefined4 *)((long)&(this_00->super__Function_base)._M_functor + 4) = local_68._4_4_;
  *(undefined4 *)((long)&(this_00->super__Function_base)._M_functor + 8) = local_68._8_4_;
  *(undefined4 *)((long)&(this_00->super__Function_base)._M_functor + 0xc) = local_68._12_4_;
  local_58 = (this_00->super__Function_base)._M_manager;
  (this_00->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_unsigned_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/Pl_Function.cc:28:13)>
       ::_M_manager;
  p_Stack_50 = this_00->_M_invoker;
  this_00->_M_invoker =
       std::
       _Function_handler<void_(const_unsigned_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/Pl_Function.cc:28:13)>
       ::_M_invoke;
  if (local_58 != (_Manager_type)0x0) {
    local_68._M_unused._M_object = pvVar1;
    local_68._8_8_ = uVar2;
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

Pl_Function::Pl_Function(char const* identifier, Pipeline* next, writer_c_t fn, void* udata) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(nullptr))
{
    m->fn = [identifier, fn, udata](unsigned char const* data, size_t len) {
        int code = fn(data, len, udata);
        if (code != 0) {
            throw std::runtime_error(
                std::string(identifier) + " function returned code " + std::to_string(code));
        }
    };
}